

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O2

void __thiscall ui::Box::show(Box *this)

{
  pointer puVar1;
  size_t i;
  ulong uVar2;
  
  (this->super_Renderable)._enabled = true;
  uVar2 = 0;
  while( true ) {
    puVar1 = (this->super_Container)._items.
             super__Vector_base<std::unique_ptr<ui::Renderable,_std::default_delete<ui::Renderable>_>,_std::allocator<std::unique_ptr<ui::Renderable,_std::default_delete<ui::Renderable>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(this->super_Container)._items.
                       super__Vector_base<std::unique_ptr<ui::Renderable,_std::default_delete<ui::Renderable>_>,_std::allocator<std::unique_ptr<ui::Renderable,_std::default_delete<ui::Renderable>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3 & 0xffffffff)
        <= uVar2) break;
    (**(code **)(*(long *)puVar1[uVar2]._M_t.
                          super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>
                          ._M_t + 0x60))();
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void Box::show() {
    Renderable::show();
    for(size_t i = 0; i < count(); ++i) {
        operator[](i)->show();
    }
}